

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexHashMap.h
# Opt level: O3

bool __thiscall Ptex::v2_4::StringKey::matches(StringKey *this,StringKey *key)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (((key->_hash == this->_hash) && (key->_len == this->_len)) && (this->_val != (char *)0x0)) {
    uVar1 = this->_len;
    uVar3 = (long)(int)uVar1 & 0xfffffffffffffff8;
    if (0 < (int)uVar3) {
      uVar3 = (long)(int)uVar1 & 0xfffffff8;
      uVar4 = 0;
      do {
        if (*(long *)(key->_val + uVar4) != *(long *)(this->_val + uVar4)) {
          return false;
        }
        uVar4 = uVar4 + 8;
      } while (uVar4 < uVar3);
    }
    iVar2 = bcmp(key->_val + uVar3,this->_val + uVar3,(ulong)(uVar1 & 7));
    return iVar2 == 0;
  }
  return false;
}

Assistant:

bool matches(const StringKey& key) volatile
    {
        return key._hash == _hash && key._len == _len && _val && 0 == memCompare(key._val, _val, _len);
    }